

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfSelectClient.cpp
# Opt level: O0

void __thiscall
xmrig::SelfSelectClient::onLogin
          (SelfSelectClient *this,IClient *param_2,Document *doc,Value *params)

{
  undefined8 in_RCX;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDX;
  long in_RDI;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_stack_00000008;
  StringRefType *in_stack_00000010;
  StringRefType *in_stack_00000018;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_00000020;
  GenericStringRef<char> local_40;
  GenericStringRef<char> local_30;
  undefined8 local_20;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  rapidjson::GenericStringRef<char>::GenericStringRef<5u>(&local_30,(char (*) [5])"mode");
  rapidjson::GenericStringRef<char>::GenericStringRef<12u>(&local_40,(char (*) [12])"self-select");
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GetAllocator(local_18);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008);
  (**(code **)(**(long **)(in_RDI + 0x28) + 0x20))
            (*(long **)(in_RDI + 0x28),in_RDI,local_18,local_20);
  return;
}

Assistant:

void xmrig::SelfSelectClient::onLogin(IClient *, rapidjson::Document &doc, rapidjson::Value &params)
{
    params.AddMember("mode", "self-select", doc.GetAllocator());

    m_listener->onLogin(this, doc, params);
}